

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

char * TagToString(Node *tag,char *buf,size_t count)

{
  NodeType NVar1;
  Bool BVar2;
  uint uVar3;
  undefined4 extraout_var;
  ctmbstr ptVar4;
  ctmbstr format;
  
  *buf = '\0';
  if (tag == (Node *)0x0) goto LAB_001512f5;
  BVar2 = prvTidynodeIsElement(tag);
  if (BVar2 == no) {
    NVar1 = tag->type;
    if (NVar1 == DocTypeTag) {
      prvTidytmbsnprintf(buf,count,"<!DOCTYPE>");
      goto LAB_001512f5;
    }
    if (NVar1 == TextNode) {
      uVar3 = 0x1fc;
    }
    else {
      if (NVar1 != XmlDecl) {
        if (NVar1 == EndTag) {
          ptVar4 = tag->element;
          format = "</%s>";
        }
        else {
          ptVar4 = tag->element;
          if (ptVar4 == (ctmbstr)0x0) goto LAB_001512f5;
          format = anon_var_dwarf_50def + 0x16;
        }
        goto LAB_001512ee;
      }
      uVar3 = 0x1ff;
    }
    ptVar4 = tidyLocalizedString(uVar3);
    format = anon_var_dwarf_50def + 0x16;
  }
  else {
    ptVar4 = tag->element;
    format = "<%s>";
  }
LAB_001512ee:
  prvTidytmbsnprintf(buf,count,format,ptVar4);
LAB_001512f5:
  uVar3 = prvTidytmbstrlen(buf);
  return (char *)CONCAT44(extraout_var,uVar3);
}

Assistant:

static char* TagToString(Node* tag, char* buf, size_t count)
{
    *buf = 0;
    if (tag)
    {
        if (TY_(nodeIsElement)(tag))
            TY_(tmbsnprintf)(buf, count, "<%s>", tag->element);
        else if (tag->type == EndTag)
            TY_(tmbsnprintf)(buf, count, "</%s>", tag->element);
        else if (tag->type == DocTypeTag)
            TY_(tmbsnprintf)(buf, count, "<!DOCTYPE>");
        else if (tag->type == TextNode)
            TY_(tmbsnprintf)(buf, count, "%s", tidyLocalizedString(STRING_PLAIN_TEXT));
        else if (tag->type == XmlDecl)
            TY_(tmbsnprintf)(buf, count, "%s", tidyLocalizedString(STRING_XML_DECLARATION));
        else if (tag->element)
            TY_(tmbsnprintf)(buf, count, "%s", tag->element);
    }
    return buf + TY_(tmbstrlen)(buf);
}